

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NodeMapRef.h
# Opt level: O0

CNodeWriteConcatenator * __thiscall
GenApi_3_4::CNodeMapRefT<GenApi_3_4::CGeneric_XMLLoaderParams>::_NewNodeWriteConcatenator
          (CNodeMapRefT<GenApi_3_4::CGeneric_XMLLoaderParams> *this)

{
  CNodeWriteConcatenator *pCVar1;
  ExceptionReporter<GenICam_3_4::AccessException> *this_00;
  char *in_RDI;
  int in_stack_ffffffffffffff44;
  char *in_stack_ffffffffffffff48;
  ExceptionReporter<GenICam_3_4::AccessException> *in_stack_ffffffffffffff50;
  
  if (*(long *)(in_RDI + 8) != 0) {
    pCVar1 = (CNodeWriteConcatenator *)(**(code **)(**(long **)(in_RDI + 8) + 0x60))();
    return pCVar1;
  }
  this_00 = (ExceptionReporter<GenICam_3_4::AccessException> *)__cxa_allocate_exception(0x1f0);
  GenICam_3_4::ExceptionReporter<GenICam_3_4::AccessException>::ExceptionReporter
            (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,in_stack_ffffffffffffff44,in_RDI);
  GenICam_3_4::ExceptionReporter<GenICam_3_4::AccessException>::Report
            (this_00,&stack0xffffffffffffff50,"Feature not present (reference not valid)");
  __cxa_throw(this_00,&GenICam_3_4::AccessException::typeinfo,
              GenICam_3_4::AccessException::~AccessException);
}

Assistant:

inline CNodeWriteConcatenator  *CNodeMapRefT<TCameraParams>::_NewNodeWriteConcatenator() const
    {
        if (_Ptr)
            return _Ptr->NewNodeWriteConcatenator();
        throw ACCESS_EXCEPTION("Feature not present (reference not valid)");
    }